

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O0

void __thiscall glslang::TSmallArrayVector::setDimSize(TSmallArrayVector *this,int i,uint size)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  uint size_local;
  int i_local;
  TSmallArrayVector *this_local;
  
  bVar1 = false;
  if (this->sizes != (TVector<glslang::TArraySize> *)0x0) {
    sVar2 = std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::size
                      (&this->sizes->
                        super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                      );
    bVar1 = i < (int)sVar2;
  }
  if (!bVar1) {
    __assert_fail("sizes != nullptr && (int)sizes->size() > i",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                  ,0xb4,"void glslang::TSmallArrayVector::setDimSize(int, unsigned int) const");
  }
  pvVar3 = std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::
           operator[](&this->sizes->
                       super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                      ,(long)i);
  if (pvVar3->node == (TIntermTyped *)0x0) {
    pvVar3 = std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::
             operator[](&this->sizes->
                         super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                        ,(long)i);
    pvVar3->size = size;
    return;
  }
  __assert_fail("(*sizes)[i].node == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                ,0xb5,"void glslang::TSmallArrayVector::setDimSize(int, unsigned int) const");
}

Assistant:

void setDimSize(int i, unsigned int size) const
    {
        assert(sizes != nullptr && (int)sizes->size() > i);
        assert((*sizes)[i].node == nullptr);
        (*sizes)[i].size = size;
    }